

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O1

void __thiscall OptStrTokIter::OptStrTokIter(OptStrTokIter *this,char *tokens,char *delimiters)

{
  size_t sVar1;
  char *pcVar2;
  ulong __n;
  
  (this->super_OptIterRwd).super_OptIter._vptr_OptIter = (_func_int **)&PTR__OptStrTokIter_00350b28;
  sVar1 = strlen(tokens);
  this->len = (uint)sVar1;
  this->str = tokens;
  this->seps = delimiters;
  this->cur = (char *)0x0;
  (this->tokstr)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  if (delimiters == (char *)0x0) {
    this->seps = default_delims;
  }
  __n = (ulong)((uint)sVar1 + 1);
  pcVar2 = (char *)operator_new__(__n);
  memset(pcVar2,0,__n);
  (this->tokstr)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = pcVar2;
  strcpy(pcVar2,this->str);
  pcVar2 = strtok(pcVar2,this->seps);
  this->cur = pcVar2;
  return;
}

Assistant:

OptStrTokIter::OptStrTokIter(const char * tokens, const char * delimiters)
   : len(unsigned(strlen(tokens))), str(tokens), seps(delimiters),
     cur(NULLSTR)
{
   if (seps == NULL)  seps = default_delims;
   tokstr = std::make_unique<char[]>(len + 1);
   (void) strcpy(tokstr.get(), str);
   cur = strtok(tokstr.get(), seps);
}